

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int compute_action(lemon *lemp,action *ap)

{
  int local_1c;
  int act;
  action *ap_local;
  lemon *lemp_local;
  
  switch(ap->type) {
  case SHIFT:
    local_1c = ((ap->x).stp)->statenum;
    break;
  case ACCEPT:
    local_1c = lemp->accAction;
    break;
  case REDUCE:
    local_1c = lemp->minReduce + ((ap->x).rp)->iRule;
    break;
  case ERROR:
    local_1c = lemp->errAction;
    break;
  default:
    local_1c = -1;
    break;
  case SHIFTREDUCE:
    if (ap->sp->index < lemp->nterminal) {
      local_1c = lemp->minShiftReduce + ((ap->x).rp)->iRule;
    }
    else {
      local_1c = lemp->minReduce + ((ap->x).rp)->iRule;
    }
  }
  return local_1c;
}

Assistant:

PRIVATE int compute_action(struct lemon *lemp, struct action *ap)
{
  int act;
  switch( ap->type ){
    case SHIFT:  act = ap->x.stp->statenum;                        break;
    case SHIFTREDUCE: {
      /* Since a SHIFT is inherient after a prior REDUCE, convert any
      ** SHIFTREDUCE action with a nonterminal on the LHS into a simple
      ** REDUCE action: */
      if( ap->sp->index>=lemp->nterminal ){
        act = lemp->minReduce + ap->x.rp->iRule;
      }else{
        act = lemp->minShiftReduce + ap->x.rp->iRule;
      }
      break;
    }
    case REDUCE: act = lemp->minReduce + ap->x.rp->iRule;          break;
    case ERROR:  act = lemp->errAction;                            break;
    case ACCEPT: act = lemp->accAction;                            break;
    default:     act = -1; break;
  }
  return act;
}